

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void * TableSettingsHandler_ReadOpen
                 (ImGuiContext_conflict *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  char cVar1;
  int iVar2;
  ImGuiTableSettings *pIVar3;
  ImGuiTableSettings *pIVar4;
  ImGuiID id;
  int columns_count;
  
  pIVar3 = (ImGuiTableSettings *)0x0;
  iVar2 = __isoc99_sscanf(name,"0x%08X,%d");
  if (1 < iVar2) {
    pIVar3 = ImGui::TableSettingsFindByID(0);
    if (pIVar3 != (ImGuiTableSettings *)0x0) {
      cVar1 = pIVar3->ColumnsCountMax;
      iVar2 = (int)cVar1;
      if (-1 < iVar2) {
        pIVar3->ID = 0;
        pIVar3->SaveFlags = 0;
        pIVar3->RefScale = 0.0;
        pIVar3->ColumnsCount = '\0';
        pIVar3->ColumnsCountMax = '\0';
        pIVar3->WantApply = false;
        pIVar3->field_0xf = 0;
        if ('\0' < cVar1) {
          pIVar4 = pIVar3 + 1;
          do {
            pIVar4->ID = 0;
            pIVar4->SaveFlags = 0;
            *(undefined2 *)&pIVar4->RefScale = 0xffff;
            *(undefined1 *)((long)&pIVar4->RefScale + 2) = 0xff;
            *(byte *)((long)&pIVar4->RefScale + 3) =
                 *(byte *)((long)&pIVar4->RefScale + 3) & 0xf0 | 4;
            pIVar4 = (ImGuiTableSettings *)&pIVar4->ColumnsCount;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
        pIVar3->ID = 0;
        pIVar3->ColumnsCount = '\0';
        pIVar3->ColumnsCountMax = cVar1;
        pIVar3->WantApply = true;
        return pIVar3;
      }
      pIVar3->ID = 0;
    }
    pIVar3 = ImGui::TableSettingsCreate(0,0);
  }
  return pIVar3;
}

Assistant:

static void* TableSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiID id = 0;
    int columns_count = 0;
    if (sscanf(name, "0x%08X,%d", &id, &columns_count) < 2)
        return NULL;

    if (ImGuiTableSettings* settings = ImGui::TableSettingsFindByID(id))
    {
        if (settings->ColumnsCountMax >= columns_count)
        {
            TableSettingsInit(settings, id, columns_count, settings->ColumnsCountMax); // Recycle
            return settings;
        }
        settings->ID = 0; // Invalidate storage, we won't fit because of a count change
    }
    return ImGui::TableSettingsCreate(id, columns_count);
}